

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O2

void __thiscall node::SnapshotMetadata::Serialize<AutoFile>(SnapshotMetadata *this,AutoFile *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<AutoFile,_unsigned_char,_5UL>(s,&SNAPSHOT_MAGIC_BYTES);
  AutoFile::operator<<(s,&VERSION);
  Serialize<AutoFile,_unsigned_char,_4UL>(s,&this->m_network_magic);
  base_blob<256U>::Serialize<AutoFile>(&(this->m_base_blockhash).super_base_blob<256U>,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    AutoFile::operator<<(s,&this->m_coins_count);
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Serialize(Stream& s) const {
        s << SNAPSHOT_MAGIC_BYTES;
        s << VERSION;
        s << m_network_magic;
        s << m_base_blockhash;
        s << m_coins_count;
    }